

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall wtlgo::bf::ASTBody::compute(ASTBody *this,VM *vm)

{
  bool bVar1;
  __shared_ptr_access<const_wtlgo::bf::AST,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  shared_ptr<const_wtlgo::bf::AST> *term;
  const_iterator __end1;
  const_iterator __begin1;
  body_t *__range1;
  VM *vm_local;
  ASTBody *this_local;
  
  __end1 = std::__cxx11::
           list<std::shared_ptr<const_wtlgo::bf::AST>,_std::allocator<std::shared_ptr<const_wtlgo::bf::AST>_>_>
           ::begin(&this->body);
  term = (shared_ptr<const_wtlgo::bf::AST> *)
         std::__cxx11::
         list<std::shared_ptr<const_wtlgo::bf::AST>,_std::allocator<std::shared_ptr<const_wtlgo::bf::AST>_>_>
         ::end(&this->body);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&term);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<const_wtlgo::bf::AST,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
              )std::_List_const_iterator<std::shared_ptr<const_wtlgo::bf::AST>_>::operator*(&__end1)
    ;
    peVar2 = std::
             __shared_ptr_access<const_wtlgo::bf::AST,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (*peVar2->_vptr_AST[2])(peVar2,vm);
    std::_List_const_iterator<std::shared_ptr<const_wtlgo::bf::AST>_>::operator++(&__end1);
  }
  return;
}

Assistant:

void ASTBody::compute(VM& vm) const {
    for(const auto& term : body)
        term->compute(vm);
}